

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.cc
# Opt level: O0

void __thiscall avro::GenericRecord::GenericRecord(GenericRecord *this,NodePtr *schema)

{
  int iVar1;
  type pNVar2;
  undefined4 extraout_var;
  GenericDatum *this_00;
  shared_ptr<avro::Node> *in_RSI;
  NodePtr *in_RDI;
  size_t i;
  GenericDatum *in_stack_ffffffffffffff88;
  NodePtr *in_stack_ffffffffffffffa0;
  GenericContainer *in_stack_ffffffffffffffb0;
  NodePtr *this_01;
  ulong local_28;
  undefined4 extraout_var_00;
  
  GenericContainer::GenericContainer
            (in_stack_ffffffffffffffb0,(Type)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa0);
  this_01 = in_RDI + 1;
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::vector
            ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)0x1d71e2);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  (*pNVar2->_vptr_Node[4])();
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::resize
            ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)this_01,
             (size_type)in_RDI);
  local_28 = 0;
  while( true ) {
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    iVar1 = (*pNVar2->_vptr_Node[4])();
    if (CONCAT44(extraout_var,iVar1) <= local_28) break;
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    iVar1 = (*pNVar2->_vptr_Node[5])(pNVar2,local_28 & 0xffffffff);
    this_00 = (GenericDatum *)CONCAT44(extraout_var_00,iVar1);
    GenericDatum::GenericDatum((GenericDatum *)this_01,in_RDI);
    std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::operator[]
              ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)(in_RDI + 1),
               local_28);
    GenericDatum::operator=(this_00,in_stack_ffffffffffffff88);
    GenericDatum::~GenericDatum((GenericDatum *)0x1d72af);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

GenericRecord::GenericRecord(const NodePtr& schema) :
    GenericContainer(AVRO_RECORD, schema) {
    fields_.resize(schema->leaves());
    for (size_t i = 0; i < schema->leaves(); ++i) {
        fields_[i] = GenericDatum(schema->leafAt(i));
    }
}